

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zreadhb.c
# Opt level: O0

int ReadVector(FILE *fp,int_t n,int_t *where,int perline,int persize)

{
  char cVar1;
  int iVar2;
  char local_a8 [8];
  char buf [100];
  int iStack_30;
  char tmp;
  int_t item;
  int_t j;
  int_t i;
  int persize_local;
  int perline_local;
  int_t *where_local;
  int_t n_local;
  FILE *fp_local;
  
  item = 0;
  while (item < n) {
    fgets(local_a8,100,(FILE *)fp);
    for (iStack_30 = 0; iStack_30 < perline && item < n; iStack_30 = iStack_30 + 1) {
      cVar1 = local_a8[(iStack_30 + 1) * persize];
      local_a8[(iStack_30 + 1) * persize] = '\0';
      iVar2 = atoi(local_a8 + iStack_30 * persize);
      local_a8[(iStack_30 + 1) * persize] = cVar1;
      where[item] = iVar2 + -1;
      item = item + 1;
    }
  }
  return 0;
}

Assistant:

static int ReadVector(FILE *fp, int_t n, int_t *where, int perline, int persize)
{
    int_t i, j, item;
    char tmp, buf[100];
    
    i = 0;
    while (i <  n) {
	fgets(buf, 100, fp);    /* read a line at a time */
	for (j=0; j<perline && i<n; j++) {
	    tmp = buf[(j+1)*persize];     /* save the char at that place */
	    buf[(j+1)*persize] = 0;       /* null terminate */
	    item = atoi(&buf[j*persize]); 
	    buf[(j+1)*persize] = tmp;     /* recover the char at that place */
	    where[i++] = item - 1;
	}
    }

    return 0;
}